

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

void __thiscall rengine::Node::append(Node *this,Node *child)

{
  Node *pNVar1;
  Node *pNVar2;
  bool bVar3;
  
  if (child == (Node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x62,"void rengine::Node::append(Node *)");
  }
  pNVar2 = this->m_child;
  bVar3 = pNVar2 != (Node *)0x0;
  if (pNVar2 != child && bVar3) {
    do {
      pNVar2 = sibling(pNVar2);
      bVar3 = pNVar2 != (Node *)0x0;
      if (pNVar2 == (Node *)0x0) break;
    } while (pNVar2 != child);
  }
  if (bVar3) {
    __assert_fail("!hasChild(child)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,99,"void rengine::Node::append(Node *)");
  }
  if (child->m_parent != (Node *)0x0) {
    __assert_fail("child->m_parent == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,100,"void rengine::Node::append(Node *)");
  }
  if (child->m_next != (Node *)0x0) {
    __assert_fail("child->m_next == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x65,"void rengine::Node::append(Node *)");
  }
  if (child->m_prev == (Node *)0x0) {
    pNVar2 = this->m_child;
    if (pNVar2 == (Node *)0x0) {
      child->m_next = child;
      child->m_prev = child;
      this->m_child = child;
    }
    else {
      pNVar1 = pNVar2->m_prev;
      pNVar1->m_next = child;
      child->m_prev = pNVar1;
      pNVar2->m_prev = child;
      child->m_next = pNVar2;
    }
    child->m_parent = this;
    return;
  }
  __assert_fail("child->m_prev == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                ,0x66,"void rengine::Node::append(Node *)");
}

Assistant:

void append(Node *child) {
        assert(child);
        assert(!hasChild(child));
        assert(child->m_parent == 0);
        assert(child->m_next == 0);
        assert(child->m_prev == 0);

        if (!m_child) {
            child->m_next = child;
            child->m_prev = child;
            m_child = child;
        } else {
            m_child->m_prev->m_next = child;
            child->m_prev = m_child->m_prev;
            m_child->m_prev = child;
            child->m_next = m_child;
        }
        child->setParent(this);
    }